

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O1

int Cudd_CheckKeys(DdManager *table)

{
  int iVar1;
  uint uVar2;
  DdSubtable *pDVar3;
  DdNode **ppDVar4;
  DdManager *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  
  iVar1 = table->size;
  if ((long)iVar1 < 1) {
    local_50 = 0;
    local_4c = 0;
    local_48 = 0;
    local_44 = 0;
    iVar9 = 0;
  }
  else {
    uVar10 = 0;
    iVar9 = 0;
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    local_50 = 0;
    do {
      pDVar3 = table->subtables;
      ppDVar4 = pDVar3[uVar10].nodelist;
      uVar13 = pDVar3[uVar10].keys;
      uVar12 = pDVar3[uVar10].shift;
      uVar2 = pDVar3[uVar10].dead;
      uVar11 = pDVar3[uVar10].slots;
      if ((uVar11 & ~(-1 << (-(char)uVar12 & 0x1fU))) != 0) {
        fprintf((FILE *)table->err,"Unique table %d is not the right power of 2\n",
                uVar10 & 0xffffffff);
        fprintf((FILE *)table->err,"    slots = %u shift = %d\n",(ulong)uVar11,(ulong)uVar12);
      }
      uVar12 = uVar2;
      uVar8 = uVar13;
      if ((ulong)uVar11 != 0) {
        uVar7 = 0;
        do {
          pDVar5 = (DdManager *)ppDVar4[uVar7];
          bVar14 = pDVar5 != table;
          bVar15 = bVar14;
          while (bVar15) {
            uVar8 = uVar8 - 1;
            uVar12 = uVar12 - ((pDVar5->sentinel).ref == 0);
            pDVar5 = (DdManager *)(pDVar5->sentinel).next;
            bVar15 = pDVar5 != table;
          }
          iVar9 = iVar9 + (uint)bVar14;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar11);
      }
      if (uVar8 != 0) {
        fprintf((FILE *)table->err,"Wrong number of keys found in unique table %d (difference=%d)\n"
                ,uVar10 & 0xffffffff);
        local_50 = local_50 + 1;
      }
      if (uVar12 != 0) {
        fprintf((FILE *)table->err,
                "Wrong number of dead found in unique table no. %d (difference=%d)\n",
                uVar10 & 0xffffffff);
      }
      local_4c = local_4c + uVar13;
      local_48 = local_48 + uVar11;
      local_44 = local_44 + uVar2;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (long)iVar1);
  }
  iVar1 = table->sizeZ;
  if (0 < (long)iVar1) {
    uVar10 = 0;
    do {
      pDVar3 = table->subtableZ;
      uVar13 = pDVar3[uVar10].keys;
      uVar12 = pDVar3[uVar10].dead;
      uVar2 = pDVar3[uVar10].slots;
      uVar11 = uVar12;
      uVar8 = uVar13;
      if ((ulong)uVar2 != 0) {
        uVar7 = 0;
        do {
          pDVar6 = pDVar3[uVar10].nodelist[uVar7];
          bVar14 = pDVar6 != (DdNode *)0x0;
          bVar15 = bVar14;
          while (bVar15) {
            uVar8 = uVar8 - 1;
            uVar11 = uVar11 - (pDVar6->ref == 0);
            pDVar6 = pDVar6->next;
            bVar15 = pDVar6 != (DdNode *)0x0;
          }
          iVar9 = iVar9 + (uint)bVar14;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      if (uVar8 != 0) {
        fprintf((FILE *)table->err,
                "Wrong number of keys found in ZDD unique table no. %d (difference=%d)\n",
                uVar10 & 0xffffffff);
        local_50 = local_50 + 1;
      }
      if (uVar11 != 0) {
        fprintf((FILE *)table->err,
                "Wrong number of dead found in ZDD unique table no. %d (difference=%d)\n",
                uVar10 & 0xffffffff);
      }
      local_4c = local_4c + uVar13;
      local_48 = local_48 + uVar2;
      local_44 = local_44 + uVar12;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (long)iVar1);
  }
  uVar13 = (table->constants).keys;
  uVar12 = (table->constants).dead;
  uVar2 = (table->constants).slots;
  uVar11 = uVar12;
  uVar8 = uVar13;
  if ((ulong)uVar2 != 0) {
    uVar10 = 0;
    do {
      pDVar6 = (table->constants).nodelist[uVar10];
      bVar14 = pDVar6 != (DdNode *)0x0;
      bVar15 = bVar14;
      while (bVar15) {
        uVar8 = uVar8 - 1;
        uVar11 = uVar11 - (pDVar6->ref == 0);
        pDVar6 = pDVar6->next;
        bVar15 = pDVar6 != (DdNode *)0x0;
      }
      iVar9 = iVar9 + (uint)bVar14;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
  }
  if (uVar8 != 0) {
    fprintf((FILE *)table->err,"Wrong number of keys found in the constant table (difference=%d)\n")
    ;
    local_50 = local_50 + 1;
  }
  if (uVar11 != 0) {
    fprintf((FILE *)table->err,"Wrong number of dead found in the constant table (difference=%d)\n",
            (ulong)uVar11);
  }
  if (uVar13 + local_4c != table->keysZ + table->keys) {
    fprintf((FILE *)table->err,"Wrong number of total keys found (difference=%d)\n",
            (ulong)((uVar13 + local_4c) - table->keys));
  }
  uVar13 = (uVar2 + local_48) - table->slots;
  if (uVar13 != 0) {
    fprintf((FILE *)table->err,"Wrong number of total slots found (difference=%d)\n",(ulong)uVar13);
  }
  if (table->minDead != (uint)(long)((double)table->slots * table->gcFrac)) {
    fprintf((FILE *)table->err,"Wrong number of minimum dead found (%u vs. %u)\n");
  }
  if (uVar12 + local_44 != table->deadZ + table->dead) {
    fprintf((FILE *)table->err,"Wrong number of total dead found (difference=%d)\n",
            (ulong)((uVar12 + local_44) - table->dead));
  }
  printf("Average length of non-empty lists = %g\n",(double)table->keys / (double)iVar9);
  return local_50;
}

Assistant:

int
Cudd_CheckKeys(
  DdManager * table)
{
    int size;
    int i,j;
    DdNodePtr *nodelist;
    DdNode *node;
    DdNode *sentinel = &(table->sentinel);
    DdSubtable *subtable;
    int keys;
    int dead;
    int count = 0;
    int totalKeys = 0;
    int totalSlots = 0;
    int totalDead = 0;
    int nonEmpty = 0;
    unsigned int slots;
    int logSlots;
    int shift;

    size = table->size;

    for (i = 0; i < size; i++) {
        subtable = &(table->subtables[i]);
        nodelist = subtable->nodelist;
        keys = subtable->keys;
        dead = subtable->dead;
        totalKeys += keys;
        slots = subtable->slots;
        shift = subtable->shift;
        logSlots = sizeof(int) * 8 - shift;
        if (((slots >> logSlots) << logSlots) != slots) {
            (void) fprintf(table->err,
                           "Unique table %d is not the right power of 2\n", i);
            (void) fprintf(table->err,
                           "    slots = %u shift = %d\n", slots, shift);
        }
        totalSlots += slots;
        totalDead += dead;
        for (j = 0; (unsigned) j < slots; j++) {
            node = nodelist[j];
            if (node != sentinel) {
                nonEmpty++;
            }
            while (node != sentinel) {
                keys--;
                if (node->ref == 0) {
                    dead--;
                }
                node = node->next;
            }
        }
        if (keys != 0) {
            (void) fprintf(table->err, "Wrong number of keys found \
in unique table %d (difference=%d)\n", i, keys);
            count++;
        }
        if (dead != 0) {
            (void) fprintf(table->err, "Wrong number of dead found \
in unique table no. %d (difference=%d)\n", i, dead);
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    size = table->sizeZ;

    for (i = 0; i < size; i++) {
        subtable = &(table->subtableZ[i]);
        nodelist = subtable->nodelist;
        keys = subtable->keys;
        dead = subtable->dead;
        totalKeys += keys;
        totalSlots += subtable->slots;
        totalDead += dead;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != NULL) {
                nonEmpty++;
            }
            while (node != NULL) {
                keys--;
                if (node->ref == 0) {
                    dead--;
                }
                node = node->next;
            }
        }
        if (keys != 0) {
            (void) fprintf(table->err, "Wrong number of keys found \
in ZDD unique table no. %d (difference=%d)\n", i, keys);
            count++;
        }
        if (dead != 0) {
            (void) fprintf(table->err, "Wrong number of dead found \
in ZDD unique table no. %d (difference=%d)\n", i, dead);
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    subtable = &(table->constants);
    nodelist = subtable->nodelist;
    keys = subtable->keys;
    dead = subtable->dead;
    totalKeys += keys;
    totalSlots += subtable->slots;
    totalDead += dead;
    for (j = 0; (unsigned) j < subtable->slots; j++) {
        node = nodelist[j];
        if (node != NULL) {
            nonEmpty++;
        }
        while (node != NULL) {
            keys--;
            if (node->ref == 0) {
                dead--;
            }
            node = node->next;
        }
    }
    if (keys != 0) {
        (void) fprintf(table->err, "Wrong number of keys found \
in the constant table (difference=%d)\n", keys);
        count++;
    }
    if (dead != 0) {
        (void) fprintf(table->err, "Wrong number of dead found \
in the constant table (difference=%d)\n", dead);
    }
    if ((unsigned) totalKeys != table->keys + table->keysZ) {
        (void) fprintf(table->err, "Wrong number of total keys found \
(difference=%d)\n", (int) (totalKeys-table->keys));
    }
    if ((unsigned) totalSlots != table->slots) {
        (void) fprintf(table->err, "Wrong number of total slots found \
(difference=%d)\n", (int) (totalSlots-table->slots));
    }
    if (table->minDead != (unsigned) (table->gcFrac * table->slots)) {
        (void) fprintf(table->err, "Wrong number of minimum dead found \
(%u vs. %u)\n", table->minDead,
        (unsigned) (table->gcFrac * (double) table->slots));
    }
    if ((unsigned) totalDead != table->dead + table->deadZ) {
        (void) fprintf(table->err, "Wrong number of total dead found \
(difference=%d)\n", (int) (totalDead-table->dead));
    }
    (void)printf("Average length of non-empty lists = %g\n",
    (double) table->keys / (double) nonEmpty);

    return(count);

}